

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationXX<std::complex<float>_>::matrix(RotationXX<std::complex<float>_> *this)

{
  uint uVar1;
  ulong *puVar2;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<float>_> SVar3;
  ulong local_28;
  ulong local_18;
  
  uVar1 = *(uint *)(in_RSI + 0x14);
  local_28 = (ulong)(*(uint *)(in_RSI + 0x18) ^ (uint)DAT_004591d0) << 0x20;
  (this->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x4;
  puVar2 = (ulong *)operator_new__(0x80);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = 0;
  *(ulong **)&(this->super_QRotationGate2<std::complex<float>_>).super_QAdjustable = puVar2;
  local_18 = (ulong)uVar1;
  *puVar2 = local_18;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = local_28;
  puVar2[4] = 0;
  puVar2[5] = local_18;
  puVar2[6] = local_28;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = local_28;
  puVar2[10] = local_18;
  puVar2[0xb] = 0;
  puVar2[0xc] = local_28;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = local_18;
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,-this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d , o , 0 ,
                                                  0 , o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }